

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVsubmit_general(EVsource source,void *data,EVFreeFunction free_func,attr_list attrs)

{
  int iVar1;
  event_item *peVar2;
  attr_list p_Var3;
  event_path_data in_RCX;
  EVFreeFunction in_RDX;
  CManager_conflict in_RSI;
  char *in_RDI;
  event_item *event;
  CManager_conflict in_stack_000000c0;
  
  peVar2 = get_free_event(in_RCX);
  peVar2->contents = Event_App_Owned;
  peVar2->event_encoded = 0;
  peVar2->decoded_event = in_RSI;
  peVar2->reference_format = *(FMFormat *)(in_RDI + 0x10);
  peVar2->format = *(CMFormat *)(in_RDI + 8);
  peVar2->free_func = in_RDX;
  peVar2->free_arg = in_RSI;
  peVar2->cm = *(CManager_conflict *)in_RDI;
  p_Var3 = CMint_add_ref_attr_list
                     ((CManager)attrs,(attr_list)event,in_RDI,(int)((ulong)in_RSI >> 0x20));
  peVar2->attrs = p_Var3;
  internal_path_submit(in_RSI,(int)((ulong)in_RDX >> 0x20),(event_item *)in_RCX);
  do {
    iVar1 = process_local_actions(in_stack_000000c0);
  } while (iVar1 != 0);
  return_event((event_path_data)source,(event_item *)data);
  return;
}

Assistant:

extern void
INT_EVsubmit_general(EVsource source, void *data, EVFreeFunction free_func, 
		 attr_list attrs)
{
    event_item *event = get_free_event(source->cm->evp);
    event->contents = Event_App_Owned;
    event->event_encoded = 0;
    event->decoded_event = data;
    event->reference_format = source->reference_format;
    event->format = source->format;
    event->free_func = free_func;
    event->free_arg = data;
    event->cm = source->cm;
    event->attrs = CMadd_ref_attr_list(source->cm, attrs);
    internal_path_submit(source->cm, source->local_stone_id, event);
    while (process_local_actions(source->cm));
    return_event(source->cm->evp, event);
}